

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

QString * __thiscall VkSpecParser::parseName(VkSpecParser *this)

{
  QStringView v;
  byte bVar1;
  bool bVar2;
  storage_type_conflict *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  char16_t *str;
  QString name;
  DataPointer *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  byte in_stack_ffffffffffffff36;
  undefined1 uVar4;
  QStringView *this_00;
  QArrayDataPointer<char16_t> local_70 [2];
  undefined1 local_30 [16];
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  this_00 = in_RDI;
  QString::QString((QString *)0x1051e7);
  while( true ) {
    bVar1 = QXmlStreamReader::atEnd();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    QXmlStreamReader::readNext();
    bVar2 = QXmlStreamReader::isEndElement((QXmlStreamReader *)0x10521c);
    bVar1 = 0;
    if (bVar2) {
      auVar3 = QXmlStreamReader::name();
      local_30 = auVar3;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_70,(Data *)0x0,L"name",4);
      QString::QString((QString *)
                       CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30))
                       ,in_stack_ffffffffffffff28);
      QStringView::QStringView<QString,_true>(this_00,(QString *)in_RDI);
      bVar1 = operator==((QStringView *)
                         CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30
                                                )),(QStringView *)in_stack_ffffffffffffff28);
      uVar4 = bVar1;
      QString::~QString((QString *)0x1052f6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT17(uVar4,CONCAT16(bVar1,in_stack_ffffffffffffff30)));
    }
    in_stack_ffffffffffffff36 = bVar1;
    if ((in_stack_ffffffffffffff36 & 1) != 0) break;
    QXmlStreamReader::text();
    v.m_data = in_RSI;
    v.m_size = (qsizetype)this_00;
    QString::operator+=((QString *)in_stack_ffffffffffffff28,v);
  }
  QString::trimmed(&local_20);
  QString::~QString((QString *)0x105368);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString VkSpecParser::parseName()
{
    QString name;
    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("name"))
            break;
        name += m_reader.text();
    }
    return name.trimmed();
}